

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void set_length(CPUS390XState_conflict *env,int reg,uint64_t length)

{
  if (((env->psw).mask & 0x100000000) == 0) {
    length = length & 0xffffffff | (ulong)*(uint *)((long)env->regs + (long)reg * 8 + 4) << 0x20;
  }
  env->regs[reg] = length;
  return;
}

Assistant:

static inline void set_length(CPUS390XState *env, int reg, uint64_t length)
{
    if (env->psw.mask & PSW_MASK_64) {
        /* 64-Bit mode */
        env->regs[reg] = length;
    } else {
        /* 24-Bit and 31-Bit mode */
        env->regs[reg] = deposit64(env->regs[reg], 0, 32, length);
    }
}